

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O1

void __thiscall
moira::Moira::dasmNegEa<(moira::Instr)83,(moira::Mode)6,(moira::Size)2>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  int iVar1;
  char *pcVar2;
  char cVar3;
  char *pcVar4;
  long lVar5;
  Ea<(moira::Mode)6,_(moira::Size)2> dst;
  Ea<(moira::Mode)6,_(moira::Size)2> local_24;
  
  Op<(moira::Mode)6,(moira::Size)2>(&local_24,this,op & 7,addr);
  pcVar4 = "neg";
  if (str->upper != false) {
    pcVar4 = "NEG";
  }
  cVar3 = *pcVar4;
  while (cVar3 != '\0') {
    pcVar4 = pcVar4 + 1;
    pcVar2 = str->ptr;
    str->ptr = pcVar2 + 1;
    *pcVar2 = cVar3;
    cVar3 = *pcVar4;
  }
  if (str->upper == false) {
    cVar3 = '.';
    lVar5 = 0;
    do {
      pcVar4 = str->ptr;
      str->ptr = pcVar4 + 1;
      *pcVar4 = cVar3;
      cVar3 = ".w"[lVar5 + 1];
      lVar5 = lVar5 + 1;
    } while (lVar5 != 2);
  }
  else {
    cVar3 = '.';
    lVar5 = 0;
    do {
      pcVar4 = str->ptr;
      str->ptr = pcVar4 + 1;
      *pcVar4 = cVar3;
      cVar3 = ".W"[lVar5 + 1];
      lVar5 = lVar5 + 1;
    } while (lVar5 != 2);
  }
  iVar1 = (this->tab).raw;
  while (pcVar4 = str->ptr, pcVar4 < str->base + iVar1) {
    str->ptr = pcVar4 + 1;
    *pcVar4 = ' ';
  }
  StrWriter::operator<<(str,&local_24);
  return;
}

Assistant:

void
Moira::dasmNegEa(StrWriter &str, u32 &addr, u16 op)
{
    auto dst = Op <M,S> ( _____________xxx(op), addr );

    str << Ins<I>{} << Sz<S>{} << tab << dst;
}